

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifssc(bifcxdef *ctx,int argc)

{
  runcxdef *prVar1;
  runsdef *prVar2;
  long lVar3;
  errcxdef *peVar4;
  char buf [80];
  
  prVar1 = ctx->bifcxrun;
  prVar2 = prVar1->runcxsp;
  if ((argc == 1) && (prVar2[-1].runstyp == '\x03')) {
    prVar1->runcxsp = prVar2 + -1;
    if (prVar2[-1].runstyp == '\x03') {
      bifcstr(ctx,buf,0x50,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
      os_strsc(buf);
      return;
    }
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  prVar1->runcxsp = prVar2 + -1;
  prVar1 = ctx->bifcxrun;
  if (prVar2[-1].runstyp == '\x01') {
    prVar2 = prVar1->runcxsp;
    lVar3 = (prVar2->runsv).runsvnum;
    prVar1->runcxsp = prVar2 + -1;
    if (prVar2[-1].runstyp == '\x01') {
      os_score((int)lVar3,*(int *)&ctx->bifcxrun->runcxsp->runsv);
      return;
    }
    peVar4 = ctx->bifcxrun->runcxerr;
  }
  else {
    peVar4 = prVar1->runcxerr;
  }
  peVar4->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3eb);
}

Assistant:

void bifssc(bifcxdef *ctx, int argc)
{
    int s1, s2;

    /* optional new way - string argument */
    if (argc == 1 && runtostyp(ctx->bifcxrun) == DAT_SSTRING)
    {
        char   buf[80];
        uchar *p;
        
        p = runpopstr(ctx->bifcxrun);
        bifcstr(ctx, buf, (size_t)sizeof(buf), p);
        tiostrsc(ctx->bifcxtio, buf);
    }
    else
    {
        /* old way - two numeric arguments (displays: x/y) */
        bifcntargs(ctx, 2, argc);
        s1 = runpopnum(ctx->bifcxrun);
        s2 = runpopnum(ctx->bifcxrun);
        tioscore(ctx->bifcxtio, s1, s2);
    }
}